

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_movem_er(m68k_info *info,int opcode,int size)

{
  uint uVar1;
  cs_m68k *op;
  
  op = build_init_op(info,0x11c,2,opcode);
  op->operands[1].type = M68K_OP_REG_BITS;
  uVar1 = read_imm_16(info);
  op->operands[1].register_bits = uVar1;
  get_ea_mode_op(info,op->operands,info->ir,opcode);
  return;
}

Assistant:

static void build_movem_er(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op1->type = M68K_OP_REG_BITS;
	op1->register_bits = read_imm_16(info);

	get_ea_mode_op(info, op0, info->ir, size);
}